

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void fill_MPP_FMT_BGR101010(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  
  uVar5 = R << 2;
  iVar4 = (G & 0xff) << 0xc;
  uVar2 = (B & 0xff) << 0x16;
  bVar3 = (byte)((uint)iVar4 >> 0x10) | (byte)(uVar2 >> 0x10);
  bVar1 = (byte)(uVar5 >> 8) & 3 | (byte)((uint)iVar4 >> 8);
  if (be == 0) {
    *p = (RK_U8)uVar5;
    p[1] = bVar1;
    p[2] = bVar3;
    uVar5 = uVar2 >> 0x18;
  }
  else {
    *p = (RK_U8)(uVar2 >> 0x18);
    p[1] = bVar3;
    p[2] = bVar1;
  }
  p[3] = (RK_U8)uVar5;
  return;
}

Assistant:

static void fill_MPP_FMT_BGR101010(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_BGR101010
    // 32 bit pixel     MSB  -------->  LSB
    //                 (00bb,bbbb,bbbb,gggg,gggg,ggrr,rrrr,rrrr)
    // big    endian   |  byte 0 |  byte 1 |  byte 2 |  byte 3 |
    // little endian   |  byte 3 |  byte 2 |  byte 1 |  byte 0 |
    RK_U32 val = (((R * 4) & 0x3ff) <<  0) |
                 (((G * 4) & 0x3ff) << 10) |
                 (((B * 4) & 0x3ff) << 20);
    if (be) {
        p[0] = (val >> 24) & 0xff;
        p[1] = (val >> 16) & 0xff;
        p[2] = (val >>  8) & 0xff;
        p[3] = (val >>  0) & 0xff;
    } else {
        p[0] = (val >>  0) & 0xff;
        p[1] = (val >>  8) & 0xff;
        p[2] = (val >> 16) & 0xff;
        p[3] = (val >> 24) & 0xff;
    }
}